

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4_stream.cpp
# Opt level: O2

void __thiscall minibag::LZ4Stream::stopRead(LZ4Stream *this)

{
  BagException *this_00;
  allocator<char> local_39;
  string local_38;
  
  if ((this->lz4s_).state != (void *)0x0) {
    roslz4_decompressEnd(&this->lz4s_);
    return;
  }
  this_00 = (BagException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"cannot close unopened lz4 stream",&local_39);
  BagException::BagException(this_00,&local_38);
  __cxa_throw(this_00,&BagException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LZ4Stream::stopRead() {
    if (!lz4s_.state) {
        throw BagException("cannot close unopened lz4 stream");
    }

    roslz4_decompressEnd(&lz4s_);
}